

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json_test.cpp
# Opt level: O2

void __thiscall
PersistentStorageJsonTestSuite_GetDomainFromEmpty_Test::TestBody
          (PersistentStorageJsonTestSuite_GetDomainFromEmpty_Test *this)

{
  Status SVar1;
  pointer *__ptr;
  char *in_R9;
  AssertHelper local_b8;
  AssertHelper local_b0;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  Domain returnValue;
  PersistentStorageJson psj;
  
  std::__cxx11::string::string((string *)&returnValue,"./tmp/test.tmp",(allocator *)&gtest_ar_);
  ot::commissioner::persistent_storage::PersistentStorageJson::PersistentStorageJson
            (&psj,(string *)&returnValue);
  std::__cxx11::string::~string((string *)&returnValue);
  SVar1 = ot::commissioner::persistent_storage::PersistentStorageJson::Open(&psj);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ = SVar1 == kSuccess;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&gtest_ar__1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&returnValue,(internal *)&gtest_ar_,
               (AssertionResult *)"psj.Open() == PersistentStorage::Status::kSuccess","false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x101,(char *)returnValue._0_8_);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&gtest_ar__1);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    std::__cxx11::string::~string((string *)&returnValue);
    if ((long *)CONCAT71(gtest_ar__1._1_7_,gtest_ar__1.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__1._1_7_,gtest_ar__1.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  ot::commissioner::persistent_storage::Domain::Domain(&returnValue);
  ot::commissioner::persistent_storage::DomainId::DomainId((DomainId *)&gtest_ar_,0);
  SVar1 = ot::commissioner::persistent_storage::PersistentStorageJson::Get
                    (&psj,(RegistrarId *)&gtest_ar_,&returnValue);
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar__1.success_ = SVar1 == kNotFound;
  if (!gtest_ar__1.success_) {
    testing::Message::Message((Message *)&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
               (AssertionResult *)
               "psj.Get(DomainId(0), returnValue) == PersistentStorage::Status::kNotFound","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x105,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    if (local_b8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_b8.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__1.message_);
  SVar1 = ot::commissioner::persistent_storage::PersistentStorageJson::Close(&psj);
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar__1.success_ = SVar1 == kSuccess;
  if (!gtest_ar__1.success_) {
    testing::Message::Message((Message *)&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
               (AssertionResult *)"psj.Close() == PersistentStorage::Status::kSuccess","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x107,(char *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_));
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    if (local_b8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_b8.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__1.message_);
  std::__cxx11::string::~string((string *)&returnValue.mName);
  ot::commissioner::persistent_storage::PersistentStorageJson::~PersistentStorageJson(&psj);
  return;
}

Assistant:

TEST(PersistentStorageJsonTestSuite, GetDomainFromEmpty)
{
    PersistentStorageJson psj("./tmp/test.tmp");

    EXPECT_TRUE(psj.Open() == PersistentStorage::Status::kSuccess);

    Domain returnValue;

    EXPECT_TRUE(psj.Get(DomainId(0), returnValue) == PersistentStorage::Status::kNotFound);

    EXPECT_TRUE(psj.Close() == PersistentStorage::Status::kSuccess);
}